

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::anon_unknown_77::AsyncPipe::tryRead
          (AsyncPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  _func_int **pp_Var2;
  ImmediatePromiseNode<unsigned_long> *extraout_RDX;
  ImmediatePromiseNode<unsigned_long> *pIVar3;
  _func_int *in_R8;
  Own<kj::_::ImmediatePromiseNode<unsigned_long>_> OVar4;
  Promise<unsigned_long> PVar5;
  unsigned_long local_40;
  _func_int **local_38;
  _func_int **pp_Stack_30;
  
  if (maxBytes == 0) {
    local_40 = 0;
    OVar4 = heap<kj::_::ImmediatePromiseNode<unsigned_long>,unsigned_long>
                      ((kj *)&local_38,&local_40);
    pIVar3 = OVar4.ptr;
    (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream = local_38;
    (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Stack_30;
  }
  else {
    plVar1 = *(long **)((long)buffer + 0x20);
    if (plVar1 == (long *)0x0) {
      pp_Var2 = (_func_int **)operator_new(0x1d8);
      pp_Var2[1] = (_func_int *)0x0;
      *pp_Var2 = (_func_int *)&PTR_onReady_00629d10;
      pp_Var2[2] = (_func_int *)&PTR_fulfill_00629d58;
      *(undefined1 *)(pp_Var2 + 3) = 0;
      *(undefined1 *)(pp_Var2 + 0x2f) = 0;
      *(undefined1 *)(pp_Var2 + 0x31) = 1;
      pIVar3 = (ImmediatePromiseNode<unsigned_long> *)(pp_Var2 + 0x32);
      pp_Var2[0x32] = (_func_int *)&PTR_read_00629db8;
      pp_Var2[0x33] = (_func_int *)&PTR_write_00629e38;
      pp_Var2[0x34] = (_func_int *)(pp_Var2 + 2);
      pp_Var2[0x35] = (_func_int *)buffer;
      pp_Var2[0x36] = (_func_int *)minBytes;
      pp_Var2[0x37] = in_R8;
      pp_Var2[0x38] = (_func_int *)maxBytes;
      pp_Var2[0x39] = (_func_int *)0x0;
      pp_Var2[0x3a] = (_func_int *)0x0;
      *(ImmediatePromiseNode<unsigned_long> **)((long)buffer + 0x20) = pIVar3;
      (this->super_AsyncIoStream).super_AsyncInputStream._vptr_AsyncInputStream =
           (_func_int **)
           &kj::_::
            HeapDisposer<kj::_::AdapterPromiseNode<unsigned_long,kj::(anonymous_namespace)::AsyncPipe::BlockedRead>>
            ::instance;
      (this->super_AsyncIoStream).super_AsyncOutputStream._vptr_AsyncOutputStream = pp_Var2;
    }
    else {
      (**(code **)(*plVar1 + 8))(this,plVar1,minBytes,maxBytes);
      pIVar3 = extraout_RDX;
    }
  }
  PVar5.super_PromiseBase.node.ptr = (PromiseNode *)pIVar3;
  PVar5.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<unsigned_long>)PVar5.super_PromiseBase.node;
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    if (minBytes == 0) {
      return size_t(0);
    } else KJ_IF_MAYBE(s, state) {
      return s->tryRead(buffer, minBytes, maxBytes);
    } else {
      return newAdaptedPromise<size_t, BlockedRead>(
          *this, arrayPtr(reinterpret_cast<byte*>(buffer), maxBytes), minBytes);
    }